

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiAnalyzerSettings.cpp
# Opt level: O2

void __thiscall MidiAnalyzerSettings::LoadSettings(MidiAnalyzerSettings *this,char *settings)

{
  SimpleArchive text_archive;
  
  SimpleArchive::SimpleArchive(&text_archive);
  SimpleArchive::SetString((char *)&text_archive);
  SimpleArchive::operator>>(&text_archive,&this->mInputChannel);
  SimpleArchive::operator>>(&text_archive,&this->mBitRate);
  SimpleArchive::operator>>(&text_archive,&this->mStopBits);
  SimpleArchive::operator>>(&text_archive,&this->mParity);
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mInputChannel,true);
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(&text_archive);
  return;
}

Assistant:

void MidiAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mInputChannel;
    text_archive >> mBitRate;
    text_archive >> mStopBits;
    text_archive >> mParity;

    ClearChannels();
    AddChannel( mInputChannel, "MIDI", true );

    UpdateInterfacesFromSettings();
}